

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3ColumnFilter(int iCol,int bZero,char **ppList,int *pnList)

{
  bool bVar1;
  int local_50;
  byte local_49;
  byte *pbStack_48;
  char c;
  char *p;
  byte *pbStack_38;
  int iCurrent;
  char *pEnd;
  byte *pbStack_28;
  int nList;
  char *pList;
  int *pnList_local;
  char **ppList_local;
  int bZero_local;
  int iCol_local;
  
  pbStack_48 = (byte *)*ppList;
  pEnd._4_4_ = *pnList;
  pbStack_38 = pbStack_48 + pEnd._4_4_;
  p._4_4_ = 0;
  pbStack_28 = pbStack_48;
  pList = (char *)pnList;
  pnList_local = (int *)ppList;
  ppList_local._0_4_ = bZero;
  ppList_local._4_4_ = iCol;
  while( true ) {
    local_49 = 0;
    while( true ) {
      bVar1 = false;
      if (pbStack_48 < pbStack_38) {
        bVar1 = ((int)(char)(local_49 | *pbStack_48) & 0xfeU) != 0;
      }
      if (!bVar1) break;
      local_49 = *pbStack_48 & 0x80;
      pbStack_48 = pbStack_48 + 1;
    }
    if (ppList_local._4_4_ == p._4_4_) break;
    pEnd._4_4_ = pEnd._4_4_ - ((int)pbStack_48 - (int)pbStack_28);
    pbStack_28 = pbStack_48;
    if (pEnd._4_4_ == 0) {
      pEnd._4_4_ = 0;
LAB_001f77ef:
      if (((int)ppList_local != 0) && (pbStack_28 + pEnd._4_4_ != pbStack_38)) {
        memset(pbStack_28 + pEnd._4_4_,0,(long)pbStack_38 - (long)(pbStack_28 + pEnd._4_4_));
      }
      *(byte **)pnList_local = pbStack_28;
      *(int *)pList = pEnd._4_4_;
      return;
    }
    pbStack_48 = pbStack_48 + 1;
    if ((*pbStack_48 & 0x80) == 0) {
      p._4_4_ = (uint)*pbStack_48;
      local_50 = 1;
    }
    else {
      local_50 = sqlite3Fts3GetVarint32((char *)pbStack_48,(int *)((long)&p + 4));
    }
    pbStack_48 = pbStack_48 + local_50;
  }
  pEnd._4_4_ = (int)pbStack_48 - (int)pbStack_28;
  goto LAB_001f77ef;
}

Assistant:

static void fts3ColumnFilter(
  int iCol,                       /* Column to filter on */
  int bZero,                      /* Zero out anything following *ppList */
  char **ppList,                  /* IN/OUT: Pointer to position list */
  int *pnList                     /* IN/OUT: Size of buffer *ppList in bytes */
){
  char *pList = *ppList;
  int nList = *pnList;
  char *pEnd = &pList[nList];
  int iCurrent = 0;
  char *p = pList;

  assert( iCol>=0 );
  while( 1 ){
    char c = 0;
    while( p<pEnd && (c | *p)&0xFE ) c = *p++ & 0x80;
  
    if( iCol==iCurrent ){
      nList = (int)(p - pList);
      break;
    }

    nList -= (int)(p - pList);
    pList = p;
    if( nList==0 ){
      break;
    }
    p = &pList[1];
    p += fts3GetVarint32(p, &iCurrent);
  }

  if( bZero && &pList[nList]!=pEnd ){
    memset(&pList[nList], 0, pEnd - &pList[nList]);
  }
  *ppList = pList;
  *pnList = nList;
}